

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avCodecs.h
# Opt level: O0

void __thiscall
CodecInfo::CodecInfo(CodecInfo *this,int codecID,string *displayName,string *programName)

{
  string *programName_local;
  string *displayName_local;
  int codecID_local;
  CodecInfo *this_local;
  
  std::__cxx11::string::string((string *)&this->displayName);
  std::__cxx11::string::string((string *)&this->programName);
  this->codecID = codecID;
  std::__cxx11::string::operator=((string *)&this->displayName,(string *)displayName);
  std::__cxx11::string::operator=((string *)&this->programName,(string *)programName);
  return;
}

Assistant:

CodecInfo(const int codecID, const std::string& displayName, const std::string& programName)
    {
        this->codecID = codecID;
        this->displayName = displayName;
        this->programName = programName;
    }